

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O3

bool __thiscall features::Surf::keypoint_localization(Surf *this,Keypoint *kp)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  uint uVar4;
  element_type *peVar5;
  int i;
  int iVar6;
  long lVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  Matrix<double,_3,_3> *pMVar14;
  long lVar15;
  double *pdVar16;
  long lVar17;
  long lVar18;
  double *pdVar19;
  byte bVar20;
  float fVar21;
  float fVar22;
  undefined1 auVar23 [8];
  double dVar24;
  undefined1 local_e0 [8];
  Vec3d vec_x;
  double local_98;
  Matrix3d mat_a;
  Vec3d vec_b;
  double det_a;
  
  bVar20 = 0;
  lVar10 = *(long *)&(this->octaves).
                     super__Vector_base<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>
                     ._M_impl.super__Vector_impl_data._M_start[kp->octave].imgs.
                     super__Vector_base<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
                     ._M_impl;
  lVar13 = (long)(int)kp->sample * 0x10;
  lVar11 = *(long *)(lVar10 + -0x10 + lVar13);
  lVar15 = *(long *)(lVar10 + lVar13);
  uVar9 = (ulong)*(int *)(lVar15 + 8);
  lVar18 = *(long *)(lVar11 + 0x18);
  lVar7 = 0;
  if (lVar18 == *(long *)(lVar11 + 0x20)) {
    lVar18 = lVar7;
  }
  lVar17 = (long)((int)kp->y * *(int *)(lVar15 + 8) + (int)kp->x);
  pfVar1 = (float *)(lVar18 + lVar17 * 4);
  lVar11 = *(long *)(lVar15 + 0x18);
  if (*(long *)(lVar15 + 0x18) == *(long *)(lVar15 + 0x20)) {
    lVar11 = lVar7;
  }
  lVar10 = *(long *)(lVar10 + 0x10 + lVar13);
  lVar15 = *(long *)(lVar10 + 0x18);
  pfVar2 = (float *)(lVar11 + lVar17 * 4);
  if (lVar15 == *(long *)(lVar10 + 0x20)) {
    lVar15 = lVar7;
  }
  pfVar3 = (float *)(lVar15 + lVar17 * 4);
  fVar21 = *pfVar2;
  mat_a.m[8] = (double)-(pfVar2[1] - pfVar2[-1]) * 0.5;
  vec_b.v[0] = (double)-(pfVar2[uVar9] - pfVar2[-uVar9]) * 0.5;
  vec_b.v[1] = (double)-(*pfVar3 - *pfVar1) * 0.5;
  dVar24 = (double)fVar21 * -2.0;
  local_98 = (double)pfVar2[1] + (double)pfVar2[-1] + dVar24;
  mat_a.m[0] = (double)(((pfVar2[uVar9 + 1] - pfVar2[uVar9 - 1]) - pfVar2[1 - uVar9]) +
                       pfVar2[~uVar9]) * 0.25;
  mat_a.m[1] = (double)(((pfVar3[1] - pfVar3[-1]) - pfVar1[1]) + pfVar1[-1]) * 0.25;
  mat_a.m[3] = (double)pfVar2[uVar9] + (double)pfVar2[-uVar9] + dVar24;
  mat_a.m[4] = (double)(((pfVar3[uVar9] - pfVar3[-uVar9]) - pfVar1[uVar9]) + pfVar1[-uVar9]) * 0.25;
  mat_a.m[7] = (double)*pfVar3 + (double)*pfVar1 + dVar24;
  vec_b.v[2] = (((mat_a.m[0] * mat_a.m[1] * mat_a.m[4] +
                 local_98 * mat_a.m[3] * mat_a.m[7] + mat_a.m[0] * mat_a.m[4] * mat_a.m[1]) -
                mat_a.m[3] * mat_a.m[1] * mat_a.m[1]) - mat_a.m[0] * mat_a.m[0] * mat_a.m[7]) -
               local_98 * mat_a.m[4] * mat_a.m[4];
  if (ABS(vec_b.v[2]) <= 9.999999747378752e-06) goto LAB_0012126a;
  pdVar19 = &local_98;
  mat_a.m[2] = mat_a.m[0];
  mat_a.m[5] = mat_a.m[1];
  mat_a.m[6] = mat_a.m[4];
  math::matrix_inverse<double>
            ((Matrix<double,_3,_3> *)local_e0,(Matrix<double,_3,_3> *)pdVar19,vec_b.v + 2);
  pMVar14 = (Matrix<double,_3,_3> *)local_e0;
  pdVar16 = pdVar19;
  for (lVar10 = 9; lVar10 != 0; lVar10 = lVar10 + -1) {
    ((Matrix<double,_3,_3> *)pdVar16)->m[0] = pMVar14->m[0];
    pMVar14 = (Matrix<double,_3,_3> *)((long)pMVar14 + ((ulong)bVar20 * -2 + 1) * 8);
    pdVar16 = (double *)((long)pdVar16 + ((ulong)bVar20 * -2 + 1) * 8);
  }
  lVar10 = 0;
  do {
    dVar24 = 0.0;
    lVar11 = 0;
    do {
      dVar24 = dVar24 + *(double *)((long)pdVar19 + lVar11) *
                        *(double *)((long)mat_a.m + lVar11 + 0x40);
      lVar11 = lVar11 + 8;
    } while (lVar11 != 0x18);
    vec_x.v[lVar10 + -1] = dVar24;
    lVar10 = lVar10 + 1;
    pdVar19 = pdVar19 + 3;
  } while (lVar10 != 3);
  auVar23 = (undefined1  [8])vec_x.v[0];
  if (vec_x.v[0] <= (double)local_e0) {
    auVar23 = local_e0;
  }
  lVar10 = (ulong)((double)local_e0 < vec_x.v[0]) << 3;
  if ((double)auVar23 < vec_x.v[1]) {
    lVar10 = 0x10;
  }
  if (*(double *)((long)vec_x.v + lVar10 + -8) <= 0.5) {
    auVar23 = (undefined1  [8])vec_x.v[0];
    if ((double)local_e0 <= vec_x.v[0]) {
      auVar23 = local_e0;
    }
    lVar10 = (ulong)(vec_x.v[0] < (double)local_e0) << 3;
    if (vec_x.v[1] < (double)auVar23) {
      lVar10 = 0x10;
    }
    pdVar19 = (double *)((long)vec_x.v + lVar10 + -8);
    if (-0.5 < *pdVar19 || *pdVar19 == -0.5) {
      dVar24 = 0.0;
      lVar10 = 0;
      do {
        dVar24 = dVar24 + *(double *)((long)mat_a.m + lVar10 + 0x40) *
                          *(double *)((long)vec_x.v + lVar10 + -8);
        lVar10 = lVar10 + 8;
      } while (lVar10 != 0x18);
      if ((this->options).contrast_threshold <= (float)(dVar24 * -0.5 + (double)fVar21)) {
        uVar4 = kp->octave;
        iVar6 = 2 - (uint)(uVar4 == 0);
        uVar12 = 1;
        if (1 < uVar4) {
          do {
            iVar6 = iVar6 * iVar6;
            uVar12 = uVar12 * 2;
          } while (uVar12 <= uVar4 >> 1);
        }
        iVar8 = uVar4 - uVar12;
        if (uVar12 <= uVar4 && iVar8 != 0) {
          do {
            iVar6 = iVar6 * 2;
            iVar8 = iVar8 + -1;
          } while (iVar8 != 0);
        }
        fVar22 = (float)(((double)local_e0 + (double)kp->x) * (double)iVar6);
        kp->x = fVar22;
        fVar21 = (float)((vec_x.v[0] + (double)kp->y) * (double)iVar6);
        kp->y = fVar21;
        kp->sample = (float)(vec_x.v[1] + (double)kp->sample);
        if (0.0 <= fVar22) {
          peVar5 = (this->sat).super___shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          lVar7 = 0;
          if (((float)(peVar5->super_TypedImageBase<long>).super_ImageBase.w < fVar22 + 1.0) ||
             (fVar21 < 0.0)) goto LAB_0012126a;
          if (fVar21 + 1.0 <= (float)(peVar5->super_TypedImageBase<long>).super_ImageBase.h) {
            lVar7 = 1;
            goto LAB_0012126a;
          }
        }
      }
    }
  }
  lVar7 = 0;
LAB_0012126a:
  return SUB81(lVar7,0);
}

Assistant:

bool
Surf::keypoint_localization (Keypoint* kp)
{
    int const sample = static_cast<int>(kp->sample);
    int const w = this->octaves[kp->octave].imgs[sample]->width();
    //int const h = this->octaves[kp->octave].imgs[sample]->height();
    int off = static_cast<int>(kp->x) + static_cast<int>(kp->y) * w;
    Octave::RespType const *s0, *s1, *s2;
    s0 = this->octaves[kp->octave].imgs[sample - 1]->get_data_pointer() + off;
    s1 = this->octaves[kp->octave].imgs[sample]->get_data_pointer() + off;
    s2 = this->octaves[kp->octave].imgs[sample + 1]->get_data_pointer() + off;

    float N9[3][9] =
    {
        { s0[-1-w], s0[-w], s0[1-w], s0[-1], s0[0], s0[1], s0[w-1], s0[w], s0[1+w] },
        { s1[-1-w], s1[-w], s1[1-w], s1[-1], s1[0], s1[1], s1[w-1], s1[w], s1[1+w] },
        { s2[-1-w], s2[-w], s2[1-w], s2[-1], s2[0], s2[1], s2[w-1], s2[w], s2[1+w] }
    };

    /* Switch to processing in double. Determinant can be very large. */
    math::Vec3d vec_b;
    math::Matrix3d mat_a;
    vec_b[0] = -(N9[1][5] - N9[1][3]) * 0.5;  // 1st deriv x.
    vec_b[1] = -(N9[1][7] - N9[1][1]) * 0.5;  // 1st deriv y.
    vec_b[2] = -(N9[2][4] - N9[0][4]) * 0.5;  // 1st deriv s.

    mat_a[0] = N9[1][3] - 2.0 * N9[1][4] + N9[1][5];                 // xx
    mat_a[1] = (N9[1][8] - N9[1][6] - N9[1][2] + N9[1][0]) * 0.25;   // xy
    mat_a[2] = (N9[2][5] - N9[2][3] - N9[0][5] + N9[0][3]) * 0.25;   // xs
    mat_a[3] = mat_a[1];                                             // yx
    mat_a[4] = N9[1][1] - 2.0 * N9[1][4] + N9[1][7];                 // yy
    mat_a[5] = (N9[2][7] - N9[2][1] - N9[0][7] + N9[0][1]) * 0.25;   // ys
    mat_a[6] = mat_a[2];                                             // sx
    mat_a[7] = mat_a[5];                                             // sy
    mat_a[8] = N9[0][4] - 2.0 * N9[1][4] + N9[2][4];                 // ss

    /* Compute determinant to detect singular matrix. */
    double det_a = math::matrix_determinant(mat_a);
    //std::cout << "Determinant: " << det_a << std::endl;
    if (MATH_EPSILON_EQ(det_a, 0.0f, 1.0e-5f))
    {
        //std::cout << "Rejection keypoint: det = " << det_a << std::endl;
        return false;
    }

    /* Invert the matrix to get the accurate keypoint. */
    mat_a = math::matrix_inverse(mat_a, det_a);
    math::Vec3d vec_x = mat_a * vec_b;

    /* Reject keypoint if location is too far off original point. */
    if (vec_x.maximum() > 0.5 || vec_x.minimum() < -0.5f)
        return false;

    /* Compute actual DoG value at accurate keypoint x. */
    float dog_value = N9[1][4] - 0.5 * vec_b.dot(vec_x);
    if (dog_value < this->options.contrast_threshold)
    {
        //std::cout << "Rejection keypoint: Contrast Thres" << std::endl;
        return false;
    }

    /* Update keypoint. */
    float sampling = static_cast<float>(math::fastpow(2, kp->octave));
    kp->x = (kp->x + vec_x[0]) * sampling;
    kp->y = (kp->y + vec_x[1]) * sampling;
    // OpenSURF code: ipt.scale = static_cast<float>((0.1333f) * (m->filter + xi * filterStep));
    kp->sample += vec_x[2]; // Is this correct? No! FIXME!

    if (kp->x < 0.0f || kp->x + 1.0f > this->sat->width()
        || kp->y < 0.0f || kp->y + 1.0f > this->sat->height())
    {
        //std::cout << "SURF: Rejection keypoint: OOB "
        //    << kp->x << " " << kp->y  << " / " << vec_x[0] << " "
        //    << vec_x[1] << std::endl;
        return false;
    }

    return true;
}